

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O1

ALLEGRO_PATH * al_create_path_for_directory(char *str)

{
  ALLEGRO_USTR *us;
  ALLEGRO_PATH *pAVar1;
  size_t sVar2;
  ALLEGRO_USTR *pAVar3;
  char *s;
  undefined8 *puVar4;
  
  pAVar1 = al_create_path(str);
  sVar2 = al_ustr_length(pAVar1->filename);
  if (sVar2 != 0) {
    us = pAVar1->filename;
    pAVar3 = al_ustr_new("");
    pAVar1->filename = pAVar3;
    s = al_cstr(us);
    puVar4 = (undefined8 *)_al_vector_alloc_back(&pAVar1->segments);
    pAVar3 = al_ustr_new(s);
    *puVar4 = pAVar3;
    al_ustr_free(us);
  }
  return pAVar1;
}

Assistant:

ALLEGRO_PATH *al_create_path_for_directory(const char *str)
{
   ALLEGRO_PATH *path = al_create_path(str);
   if (al_ustr_length(path->filename)) {
      ALLEGRO_USTR *last = path->filename;
      path->filename = al_ustr_new("");
      al_append_path_component(path, al_cstr(last));
      al_ustr_free(last);
   }
   return path;
}